

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int node_edge_compare(void *l,void *r)

{
  return (uint)(*r <= *l) * 2 + -1;
}

Assistant:

static int node_edge_compare (const void *l, const void *r)
{
    /* 
     * NOTE: Because edge alphabets are unique in every node we ignore
     * equivalence case.
     */
    if (((struct act_edge *)l)->alpha >= ((struct act_edge *)r)->alpha)
        return 1;
    else
        return -1;
}